

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdLaneOpExpr
          (ExprVisitorDelegate *this,SimdLaneOpExpr *expr)

{
  WatWriter *this_00;
  char *s;
  SimdLaneOpExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName(&expr->opcode);
  WritePutsSpace(this_00,s);
  Writef(this->writer_,"%lu",expr->val);
  WritePutsNewline(this->writer_,"");
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdLaneOpExpr(SimdLaneOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->Writef("%" PRIu64, (expr->val));
  writer_->WritePutsNewline("");
  return Result::Ok;
}